

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O0

QDataStream * __thiscall QDataStream::operator<<(QDataStream *this,qint16 i)

{
  ssize_t sVar1;
  size_t __n;
  short in_SI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  short local_a;
  size_t local_8;
  
  __n = *(size_t *)(in_FS_OFFSET + 0x28);
  local_a = in_SI;
  local_8 = __n;
  if ((in_RDI->dev != (QIODevice *)0x0) && (in_RDI->q_status == '\0')) {
    if ((in_RDI->noswap & 1U) == 0) {
      local_a = qbswap<short,void>(0);
    }
    sVar1 = QIODevice::write(in_RDI->dev,(int)&local_a,(void *)0x2,__n);
    if (sVar1 != 2) {
      in_RDI->q_status = '\x03';
    }
  }
  if (*(size_t *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &QDataStream::operator<<(qint16 i)
{
    CHECK_STREAM_WRITE_PRECOND(*this)
    if (!noswap) {
        i = qbswap(i);
    }
    if (dev->write((char *)&i, sizeof(qint16)) != sizeof(qint16))
        q_status = WriteFailed;
    return *this;
}